

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::scanStruct(Parser *this,ScannedTopLevelItem *item)

{
  bool bVar1;
  Module *pMVar2;
  vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string_view name_00;
  undefined1 local_c8 [16];
  string local_b8;
  CompileMessage local_98;
  undefined1 local_60 [16];
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  string name;
  ScannedTopLevelItem *item_local;
  Parser *this_local;
  
  name.field_2._8_8_ = item;
  readQualifiedGeneralIdentifier_abi_cxx11_((string *)local_38,this);
  pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
  local_60 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
  name_00._M_str = local_60._0_8_;
  name_00._M_len = (size_t)&pMVar2->structs;
  Module::Structs::find((Structs *)local_40,name_00);
  bVar1 = RefCountedPtr<soul::Structure>::operator!=
                    ((RefCountedPtr<soul::Structure> *)local_40,(Structure *)0x0);
  RefCountedPtr<soul::Structure>::~RefCountedPtr((RefCountedPtr<soul::Structure> *)local_40);
  if (bVar1) {
    Errors::nameInUse<std::__cxx11::string&>(&local_98,(Errors *)local_38,args);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_98);
    CompileMessage::~CompileMessage(&local_98);
  }
  pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
  std::__cxx11::string::string((string *)(local_c8 + 0x10),(string *)local_38);
  Module::Structs::add(&pMVar2->structs,(string *)(local_c8 + 0x10));
  std::__cxx11::string::~string((string *)(local_c8 + 0x10));
  local_c8._8_8_ = "{";
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)"{");
  this_00 = (vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)
            (name.field_2._8_8_ + 0x40);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  getCurrentTokeniserPosition
            ((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              *)local_c8);
  std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::push_back
            (this_00,(value_type *)local_c8);
  skipPastNextOccurrenceOf(this,(TokenType)0x54ceac);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void scanStruct (ScannedTopLevelItem& item)
    {
        auto name = readQualifiedGeneralIdentifier();

        if (module->structs.find (name) != nullptr)
            throwError (Errors::nameInUse (name));

        module->structs.add (std::move (name));
        expect (HEARTOperator::openBrace);
        item.structBodyCode.push_back (getCurrentTokeniserPosition());
        skipPastNextOccurrenceOf (HEARTOperator::closeBrace);
    }